

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestresult.cpp
# Opt level: O3

bool checkStatement(bool statement,char *msg,char *file,int line)

{
  undefined7 in_register_00000039;
  bool bVar1;
  
  if ((int)CONCAT71(in_register_00000039,statement) == 0) {
    if (QTest::expectFailMode == 0) {
      QTestResult::addFailure(msg,file,line);
      return false;
    }
    if (QTest::blacklistCurrentTest == '\x01') {
      QTestLog::addBXFail(QTest::expectFailComment,file,line);
    }
    else {
      QTestLog::addXFail(QTest::expectFailComment,file,line);
    }
  }
  else {
    if (QTest::expectFailMode == 0) {
      return true;
    }
    if (QTest::blacklistCurrentTest == '\x01') {
      QTestLog::addBXPass(msg,file,line);
    }
    else {
      QTestLog::addXPass(msg,file,line);
    }
    QTest::setFailed(true);
  }
  bVar1 = QTest::expectFailMode == 2;
  QTest::expectFailMode = 0;
  if (QTest::expectFailComment != (char *)0x0) {
    operator_delete__(QTest::expectFailComment);
  }
  QTest::expectFailComment = (char *)0x0;
  return bVar1;
}

Assistant:

static bool checkStatement(bool statement, const char *msg, const char *file, int line)
{
    if (statement) {
        if (QTest::expectFailMode) {
            if (QTest::blacklistCurrentTest)
                QTestLog::addBXPass(msg, file, line);
            else
                QTestLog::addXPass(msg, file, line);

            QTest::setFailed(true);
            // Should B?XPass always (a) continue or (b) abort, regardless of mode ?
            bool doContinue = (QTest::expectFailMode == QTest::Continue);
            clearExpectFail();
            return doContinue;
        }
        return true;
    }

    if (QTest::expectFailMode) {
        if (QTest::blacklistCurrentTest)
            QTestLog::addBXFail(QTest::expectFailComment, file, line);
        else
            QTestLog::addXFail(QTest::expectFailComment, file, line);
        bool doContinue = (QTest::expectFailMode == QTest::Continue);
        clearExpectFail();
        return doContinue;
    }

    QTestResult::addFailure(msg, file, line);
    return false;
}